

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogGetSGMLSystem(xmlHashTablePtr catal,xmlChar *sysID)

{
  void *pvVar1;
  xmlCatalogEntryPtr entry;
  xmlChar *sysID_local;
  xmlHashTablePtr catal_local;
  
  if (catal == (xmlHashTablePtr)0x0) {
    catal_local = (xmlHashTablePtr)0x0;
  }
  else {
    pvVar1 = xmlHashLookup(catal,sysID);
    if (pvVar1 == (void *)0x0) {
      catal_local = (xmlHashTablePtr)0x0;
    }
    else if (*(int *)((long)pvVar1 + 0x18) == 0xd) {
      catal_local = *(xmlHashTablePtr *)((long)pvVar1 + 0x30);
    }
    else {
      catal_local = (xmlHashTablePtr)0x0;
    }
  }
  return (xmlChar *)catal_local;
}

Assistant:

static const xmlChar *
xmlCatalogGetSGMLSystem(xmlHashTablePtr catal, const xmlChar *sysID) {
    xmlCatalogEntryPtr entry;

    if (catal == NULL)
	return(NULL);

    entry = (xmlCatalogEntryPtr) xmlHashLookup(catal, sysID);
    if (entry == NULL)
	return(NULL);
    if (entry->type == SGML_CATA_SYSTEM)
	return(entry->URL);
    return(NULL);
}